

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chain_matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_true>_>_>
::multiply_target_and_add_to
          (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_false,_true,_false,_true>_>_>
           *this,Index sourceColumnIndex,Field_element *coefficient,Index targetColumnIndex)

{
  Index local_3c;
  anon_class_32_4_5df6e713 local_38;
  
  local_3c = sourceColumnIndex;
  local_38.col = get_column(this,targetColumnIndex);
  local_38.coefficient = coefficient;
  local_38.sourceColumnIndex = &local_3c;
  local_38.this = this;
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,true>>>
  ::
  _add_to<Gudhi::persistence_matrix::Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,true>>>::multiply_target_and_add_to(unsigned_int,bool_const&,unsigned_int)::_lambda()_1_>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,false,true,false,true,false,true>>>
              *)this,local_38.col,&local_38);
  return;
}

Assistant:

inline void Chain_matrix<Master_matrix>::multiply_target_and_add_to(Index sourceColumnIndex,
                                                                    const Field_element& coefficient,
                                                                    Index targetColumnIndex)
{
  auto& col = get_column(targetColumnIndex);
  _add_to(col, [&]() { col.multiply_target_and_add(coefficient, get_column(sourceColumnIndex)); });
}